

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

void Extra_Permutations_rec(char **pRes,int nFact,int n,char *Array)

{
  char cVar1;
  int nFact_00;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  char **ppcVar8;
  
  if (n == 1) {
    **pRes = *Array;
  }
  else {
    lVar5 = (long)(n + -1);
    uVar6 = 0;
    nFact_00 = (int)((long)nFact / (long)n);
    uVar7 = 0;
    if (0 < nFact_00) {
      uVar7 = (long)nFact / (long)n & 0xffffffff;
    }
    lVar4 = (long)nFact_00;
    uVar2 = (ulong)(uint)n;
    if (n < 1) {
      uVar2 = uVar6;
    }
    ppcVar8 = pRes + lVar4 * lVar5;
    for (; uVar6 != uVar2; uVar6 = uVar6 + 1) {
      cVar1 = Array[uVar6];
      Array[uVar6] = Array[lVar5];
      Array[lVar5] = cVar1;
      for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
        ppcVar8[uVar3][lVar5] = cVar1;
      }
      Extra_Permutations_rec(pRes + (lVar5 - uVar6) * lVar4,nFact_00,n + -1,Array);
      cVar1 = Array[uVar6];
      Array[uVar6] = Array[lVar5];
      Array[lVar5] = cVar1;
      ppcVar8 = ppcVar8 + -lVar4;
    }
  }
  return;
}

Assistant:

void Extra_Permutations_rec( char ** pRes, int nFact, int n, char Array[] )
{
    char ** pNext;
    int nFactNext;
    int iTemp, iCur, iLast, k;

    if ( n == 1 )
    {
        pRes[0][0] = Array[0];
        return;
    }

    // get the next factorial
    nFactNext = nFact / n;
    // get the last entry
    iLast = n - 1;

    for ( iCur = 0; iCur < n; iCur++ )
    {
        // swap Cur and Last
        iTemp        = Array[iCur];
        Array[iCur]  = Array[iLast];
        Array[iLast] = iTemp;

        // get the pointer to the current section
        pNext = pRes + (n - 1 - iCur) * nFactNext;

        // set the last entry 
        for ( k = 0; k < nFactNext; k++ )
            pNext[k][iLast] = Array[iLast];

        // call recursively for this part
        Extra_Permutations_rec( pNext, nFactNext, n - 1, Array );

        // swap them back
        iTemp        = Array[iCur];
        Array[iCur]  = Array[iLast];
        Array[iLast] = iTemp;
    }
}